

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O1

QString * __thiscall QNetworkProxy::user(QString *__return_storage_ptr__,QNetworkProxy *this)

{
  QNetworkProxyPrivate *pQVar1;
  Data *pDVar2;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QNetworkProxyPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar2 = (pQVar1->user).d.d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (pQVar1->user).d.ptr;
    (__return_storage_ptr__->d).size = (pQVar1->user).d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QNetworkProxy::user() const
{
    return d ? d->user : QString();
}